

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool Fossilize::merge_concurrent_databases_last_use
               (char *append_archive,char **source_paths,size_t num_source_paths,
               bool skip_missing_inputs)

{
  pointer puVar1;
  int iVar2;
  long lVar3;
  DatabaseInterface *pDVar4;
  mapped_type *pmVar5;
  __node_base_ptr *pp_Var6;
  uint64_t uVar7;
  bool bVar8;
  unsigned_long *hash;
  pointer __k;
  __node_base *p_Var9;
  ResourceTag tag;
  char *path;
  ulong uVar10;
  long lVar11;
  uint64_t timestamp;
  size_t timestamp_size;
  size_t hash_count;
  long local_2a0;
  long local_298;
  char *local_290;
  char **local_288;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  timestamps [10];
  
  lVar3 = 0x230;
  pp_Var6 = &timestamps[0]._M_h._M_single_bucket;
  do {
    ((_Hashtable *)(pp_Var6 + -6))->_M_buckets = pp_Var6;
    pp_Var6[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var6 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var6[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var6 + -2))->_M_max_load_factor = 1.0;
    pp_Var6[-1] = (__node_base_ptr)0x0;
    *pp_Var6 = (__node_base_ptr)0x0;
    pp_Var6 = pp_Var6 + 7;
    lVar3 = lVar3 + -0x38;
  } while (lVar3 != 0);
  lVar3 = num_source_paths + 1;
  lVar11 = 0;
  local_288 = source_paths;
  do {
    if (lVar11 == lVar3) {
      pDVar4 = create_stream_archive_database(append_archive,OverWrite);
      iVar2 = (*pDVar4->_vptr_DatabaseInterface[2])(pDVar4);
      if ((char)iVar2 == '\0') {
LAB_001376cc:
        bVar8 = false;
      }
      else {
        bVar8 = false;
        for (uVar10 = 0; uVar10 != 10; uVar10 = uVar10 + 1) {
          p_Var9 = &timestamps[uVar10]._M_h._M_before_begin;
          while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
            iVar2 = (*pDVar4->_vptr_DatabaseInterface[4])
                              (pDVar4,uVar10 & 0xffffffff,p_Var9[1]._M_nxt,
                               (_Prime_rehash_policy *)(p_Var9 + 2),8,8);
            if ((char)iVar2 == '\0') goto LAB_001376ce;
          }
        }
        bVar8 = true;
      }
LAB_001376ce:
      (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
LAB_001376d7:
      lVar3 = 0x1f8;
      do {
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)((long)&timestamps[0]._M_h._M_buckets + lVar3));
        lVar3 = lVar3 + -0x38;
      } while (lVar3 != -0x38);
      return bVar8;
    }
    path = append_archive;
    if (lVar11 != 0) {
      path = local_288[lVar11 + -1];
    }
    pDVar4 = create_stream_archive_database(path,ReadOnly);
    iVar2 = (*pDVar4->_vptr_DatabaseInterface[2])(pDVar4);
    if ((char)iVar2 == '\0') {
      if (lVar11 != 0 && skip_missing_inputs) {
        fprintf(_stderr,"Fossilize WARN: Archive %s could not be prepared, skipping.\n",path);
        goto LAB_001376b7;
      }
      (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
      if (lVar11 != 0) {
        bVar8 = false;
        goto LAB_001376d7;
      }
    }
    else {
      local_2a0 = lVar11;
      local_298 = lVar3;
      local_290 = append_archive;
      for (uVar10 = 0; append_archive = local_290, lVar3 = local_298, lVar11 = local_2a0,
          uVar10 != 10; uVar10 = uVar10 + 1) {
        hash_count = 0;
        iVar2 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,uVar10 & 0xffffffff,&hash_count,0);
        if ((char)iVar2 == '\0') goto LAB_001376cc;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&hashes,hash_count,(allocator_type *)&timestamp_size);
        iVar2 = (*pDVar4->_vptr_DatabaseInterface[6])(pDVar4,uVar10 & 0xffffffff,&hash_count);
        puVar1 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((char)iVar2 == '\0') {
LAB_001376c2:
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          goto LAB_001376cc;
        }
        for (__k = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; __k != puVar1; __k = __k + 1) {
          timestamp = 0;
          timestamp_size = 8;
          iVar2 = (*pDVar4->_vptr_DatabaseInterface[3])
                            (pDVar4,uVar10 & 0xffffffff,*__k,(allocator_type *)&timestamp_size,
                             &timestamp,0);
          if (((char)iVar2 == '\0') || (timestamp_size != 8)) goto LAB_001376c2;
          pmVar5 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)(timestamps + uVar10),__k);
          uVar7 = timestamp;
          if (timestamp < *pmVar5) {
            uVar7 = *pmVar5;
          }
          *pmVar5 = uVar7;
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      }
LAB_001376b7:
      (*pDVar4->_vptr_DatabaseInterface[1])(pDVar4);
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

bool merge_concurrent_databases_last_use(const char *append_archive, const char * const *source_paths, size_t num_source_paths,
                                         bool skip_missing_inputs)
{
	std::unordered_map<Hash, uint64_t> timestamps[RESOURCE_COUNT];

	for (size_t source = 0; source < num_source_paths + 1; source++)
	{
		const char *path = source ? source_paths[source - 1] : append_archive;
		auto source_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(path, DatabaseMode::ReadOnly));
		if (!source_db->prepare())
		{
			if (source == 0)
				continue;
			else
			{
				if (!skip_missing_inputs)
					return false;

				LOGW("Archive %s could not be prepared, skipping.\n", path);
				continue;
			}
		}

		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = static_cast<ResourceTag>(i);

			size_t hash_count = 0;
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			std::vector<Hash> hashes(hash_count);
			if (!source_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
				return false;

			for (auto &hash : hashes)
			{
				size_t timestamp_size = sizeof(uint64_t);
				uint64_t timestamp = 0;
				if (!source_db->read_entry(tag, hash, &timestamp_size, &timestamp, PAYLOAD_READ_NO_FLAGS) ||
				    timestamp_size != sizeof(uint64_t))
					return false;

				auto &entry = timestamps[i][hash];
				entry = std::max<uint64_t>(entry, timestamp);
			}
		}
	}

	auto write_db = std::unique_ptr<DatabaseInterface>(create_stream_archive_database(append_archive, DatabaseMode::OverWrite));
	if (!write_db->prepare())
		return false;

	for (unsigned i = 0; i < RESOURCE_COUNT; i++)
	{
		auto tag = static_cast<ResourceTag>(i);
		auto &ts = timestamps[i];

		for (auto &t : ts)
			if (!write_db->write_entry(tag, t.first, &t.second, sizeof(t.second), PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT))
				return false;
	}

	return true;
}